

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O3

void ERRLOGImpl(char *errMsg)

{
  size_t __n;
  char buff [1024];
  char acStack_418 [1024];
  
  builtin_strncpy(acStack_418,"ERROR: ",7);
  __n = strlen(errMsg);
  memcpy(acStack_418 + 7,errMsg,__n);
  acStack_418[__n + 7] = '\n';
  pthread_once(&Singleton<LogManager>::m_once,Singleton<LogManager>::init);
  AsyncLog::Append((AsyncLog *)
                   Singleton<LogManager>::m_ptInstance._M_t.
                   super___uniq_ptr_impl<LogManager,_std::default_delete<LogManager>_>._M_t.
                   super__Tuple_impl<0UL,_LogManager_*,_std::default_delete<LogManager>_>.
                   super__Head_base<0UL,_LogManager_*,_false>._M_head_impl,acStack_418,__n + 8);
  return;
}

Assistant:

void ERRLOGImpl(const char * errMsg)
{
	char buff[1024];
	memcpy(buff, "ERROR: ", 7);
	size_t writeSize = 7;
	size_t nErrmsg = strlen(errMsg);
	memcpy(buff + writeSize, errMsg, nErrmsg);
	writeSize += nErrmsg;
	// FIX ME may overflow
	buff[writeSize] = '\n';
	writeSize += 1;
	WriteLogImpl(buff, writeSize);
}